

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O3

void cmprintf(cm_printf_type type,size_t test_number,char *test_name,char *error_message)

{
  char cVar1;
  cm_message_output cVar2;
  char *pcVar3;
  char *pcVar4;
  char *__s;
  
  cVar2 = cm_get_output();
  if (cVar2 != CM_OUTPUT_TAP) {
    if (cVar2 == CM_OUTPUT_SUBUNIT) {
      (*(code *)(&DAT_001083d0 + *(int *)(&DAT_001083d0 + (ulong)type * 4)))();
      return;
    }
    if (cVar2 != CM_OUTPUT_STDOUT) {
      return;
    }
    (*(code *)(&DAT_001083e4 + *(int *)(&DAT_001083e4 + (ulong)type * 4)))();
    return;
  }
  switch(type) {
  case PRINTF_TEST_SUCCESS:
    pcVar4 = "ok %u - %s\n";
    break;
  case PRINTF_TEST_FAILURE:
    print_message("not ok %u - %s\n",test_number & 0xffffffff,test_name);
    if (error_message == (char *)0x0) {
      return;
    }
    pcVar4 = strdup(error_message);
    if (pcVar4 == (char *)0x0) {
      return;
    }
    cVar1 = *pcVar4;
    __s = pcVar4;
    do {
      if (cVar1 == '\0') {
LAB_001067b2:
        free(pcVar4);
        return;
      }
      pcVar3 = strchr(__s,10);
      if (pcVar3 == (char *)0x0) {
        print_message("# %s\n",__s);
        goto LAB_001067b2;
      }
      *pcVar3 = '\0';
      print_message("# %s\n",__s);
      __s = pcVar3 + 1;
      cVar1 = pcVar3[1];
    } while( true );
  case PRINTF_TEST_ERROR:
    print_message("not ok %u - %s %s\n",test_number & 0xffffffff,test_name,error_message);
    return;
  case PRINTF_TEST_SKIPPED:
    pcVar4 = "not ok %u # SKIP %s\n";
    break;
  default:
    return;
  }
  print_message(pcVar4,test_number & 0xffffffff,test_name);
  return;
}

Assistant:

static void cmprintf(enum cm_printf_type type,
                     size_t test_number,
                     const char *test_name,
                     const char *error_message)
{
    enum cm_message_output output;

    output = cm_get_output();

    switch (output) {
    case CM_OUTPUT_STDOUT:
        cmprintf_standard(type, test_name, error_message);
        break;
    case CM_OUTPUT_SUBUNIT:
        cmprintf_subunit(type, test_name, error_message);
        break;
    case CM_OUTPUT_TAP:
        cmprintf_tap(type, test_number, test_name, error_message);
        break;
    case CM_OUTPUT_XML:
        break;
    }
}